

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O3

void SysPageProtect(void *page,int protect)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  AddressRange *pAVar5;
  AddressRange *pAVar6;
  byte bVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  
  pvVar8 = pthread_getspecific(tsdKey);
  iVar4 = *(int *)((long)pvVar8 + 0x460);
  *(int *)((long)pvVar8 + 0x460) = iVar4 + 1;
  if (iVar4 == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
  }
  bVar7 = (byte)shiftPage;
  for (pAVar5 = ranges; pAVar6 = dedicatedRanges, pAVar5 != (AddressRange *)0x0;
      pAVar5 = pAVar5->next) {
    pvVar8 = pAVar5->base;
    if ((pvVar8 <= page) && (page < (void *)((pAVar5->size << (bVar7 & 0x3f)) + (long)pvVar8))) {
      lVar9 = (long)page - (long)pvVar8 >> (bVar7 & 0x3f);
      bVar3 = *(byte *)((long)&pAVar5[1].next + lVar9);
      bVar11 = 0;
      if ('\0' < (char)bVar3) {
        bVar11 = bVar3;
      }
      uVar10 = lVar9 - (ulong)bVar11;
      PlatProtectPages((void *)((uVar10 << (bVar7 & 0x3f)) + (long)pvVar8),
                       -(long)*(char *)((long)pAVar5 + uVar10 + 0x28),protect);
      bVar7 = '\x01' << ((byte)uVar10 & 7);
      if (protect == 0) {
        pbVar2 = (byte *)((long)&pAVar5[1].next + (uVar10 >> 3) + pAVar5->size);
        *pbVar2 = *pbVar2 | bVar7;
      }
      else {
        pbVar2 = (byte *)((long)&pAVar5[1].next + (uVar10 >> 3) + pAVar5->size);
        *pbVar2 = *pbVar2 & ~bVar7;
      }
      goto LAB_00106218;
    }
  }
  do {
    if (pAVar6 == (AddressRange *)0x0) {
      Col_Error(COL_FATAL,ColibriDomain,2,"Page not found");
LAB_00106218:
      pvVar8 = pthread_getspecific(tsdKey);
      piVar1 = (int *)((long)pvVar8 + 0x460);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
        return;
      }
      return;
    }
    pvVar8 = pAVar6->base;
    if ((pvVar8 <= page) && (page < (void *)((pAVar6->size << (bVar7 & 0x3f)) + (long)pvVar8))) {
      PlatProtectPages(pvVar8,pAVar6->size,protect);
      *(bool *)&pAVar6[1].next = protect == 0;
      goto LAB_00106218;
    }
    pAVar6 = pAVar6->next;
  } while( true );
}

Assistant:

void
SysPageProtect(
    void * page,    /*!< Page belonging to page group to protect. */
    int protect)    /*!< Whether to protect or unprotect page group. */
{
    size_t index, size;
    AddressRange * range;

    PlatEnterProtectAddressRanges();
    {
        /*
         * Get range info for page.
         */

        range = ranges;
        while (range) {
            if (page >= range->base && (char *) page < (char *) range->base
                    + (range->size << shiftPage)) {
                break;
            }
            range = range->next;
        }
        if (!range) {
            /*
             * Likely dedicated address range.
             */

            range = dedicatedRanges;
            while (range) {
                if (page >= range->base && (char *) page < (char *) range->base
                        + (range->size << shiftPage)) {
                    break;
                }
                range = range->next;
            }
            if (!range) {
                /*
                 * Not found.
                 */

                /*! @fatal{COL_ERROR_MEMORY,Page not found} */
                Col_Error(COL_FATAL, ColibriDomain, COL_ERROR_MEMORY,
                        "Page not found");
                goto end;
            }

            /*
             * Update protection & write tracking flag for whole range.
             */

            PlatProtectPages(range->base, range->size, protect);
            range->allocInfo[0] = !protect;
            goto end;
        }

        index = ((char *) page - (char *) range->base) >> shiftPage;
        ASSERT(range->allocInfo[index] != 0);
        if (range->allocInfo[index] > 0) index -= range->allocInfo[index];
        size = -range->allocInfo[index];
        ASSERT(size > 0);
        ASSERT(index+size <= range->size);

        /*
         * Update protection & write tracking flag for page group (only mark
         * first one in page group).
         */

        PlatProtectPages((char *) range->base + (index << shiftPage), size,
                protect);
        if (protect) {
            range->allocInfo[range->size+(index>>3)] &= ~(1<<(index&7));
        } else {
            range->allocInfo[range->size+(index>>3)] |= (1<<(index&7));
        }
    }
end:
    PlatLeaveProtectAddressRanges();
}